

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall
efsw::String::substr(String *__return_storage_ptr__,String *this,size_t pos,size_t n)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  substr(&local_30,&this->mString,pos,n);
  String(__return_storage_ptr__,&local_30);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

String String::substr( std::size_t pos, std::size_t n ) const {
	return String( mString.substr( pos, n ) );
}